

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.h
# Opt level: O0

void __thiscall CharContent::CharContent(CharContent *this,char *cc)

{
  size_t __n;
  char *pcVar1;
  size_t n;
  char *cc_local;
  CharContent *this_local;
  
  this->_vptr_CharContent = (_func_int **)&PTR__CharContent_00132c18;
  this->npos = 0xffffffffffffffff;
  __n = strlen(cc);
  if (__n == 0) {
    pcVar1 = (char *)operator_new__(10);
    this->m = pcVar1;
    this->size = 0;
    this->m_length = 10;
    memset(this->m,0,this->m_length);
  }
  else {
    this->m_length = __n << 1;
    pcVar1 = (char *)operator_new__(this->m_length);
    this->m = pcVar1;
    this->size = __n;
    memset(this->m,0,this->m_length);
    memmove(this->m,cc,__n);
  }
  return;
}

Assistant:

CharContent(const char *cc){
        size_t n=strlen(cc);
        if(n==0){
            m=new char [10];
            size=0;
            m_length=10;
            memset(m,'\0',m_length);
            return;
        }else{
            m_length=2*n;
            m=new char [m_length];
            size=n;
            memset(m,'\0',m_length);
            memmove(m,cc,n);
			return;
        }
    }